

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::average<unsigned_char>
               (uchar *src,int sstride,int uw,int vw,uchar *dst,int nchan)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  undefined8 uStack_70;
  undefined1 auStack_68 [12];
  int local_5c;
  int i_1;
  float scale;
  int i;
  uchar *rowend;
  uchar *end;
  int rowskip;
  int rowlen;
  float *buff;
  uchar *puStack_28;
  int nchan_local;
  uchar *dst_local;
  int local_18;
  int vw_local;
  int uw_local;
  int sstride_local;
  uchar *src_local;
  
  lVar1 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  _rowskip = auStack_68 + lVar1;
  buff._4_4_ = nchan;
  puStack_28 = dst;
  dst_local._4_4_ = vw;
  local_18 = uw;
  vw_local = sstride;
  _uw_local = src;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0xad2b2d;
  memset(auStack_68 + lVar1,0,(long)nchan << 2);
  pbVar2 = _uw_local + dst_local._4_4_ * (vw_local / 1);
  for (; _uw_local != pbVar2; _uw_local = _uw_local + (vw_local / 1 - local_18 * buff._4_4_)) {
    pbVar3 = _uw_local + local_18 * buff._4_4_;
    while (_uw_local != pbVar3) {
      for (i_1 = 0; i_1 < buff._4_4_; i_1 = i_1 + 1) {
        *(float *)(_rowskip + (long)i_1 * 4) =
             (float)*_uw_local + *(float *)(_rowskip + (long)i_1 * 4);
        _uw_local = _uw_local + 1;
      }
    }
  }
  for (local_5c = 0; local_5c < buff._4_4_; local_5c = local_5c + 1) {
    puStack_28[local_5c] =
         (uchar)(int)(*(float *)(_rowskip + (long)local_5c * 4) *
                     (1.0 / (float)(local_18 * dst_local._4_4_)));
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }